

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseExpr(Parser *this,QList<QCss::Value> *values)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Value local_88;
  Value local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.type = Unknown;
  local_60._4_4_ = 0xaaaaaaaa;
  local_60.variant.d.data.shared = (PrivateShared *)0x0;
  local_60.variant.d.data._8_8_ = 0;
  local_60.variant.d.data._16_8_ = 0;
  local_60.variant.d._24_8_ = 2;
  bVar1 = parseTerm(this,&local_60);
  if (bVar1) {
    QList<QCss::Value>::emplaceBack<QCss::Value_const&>(values,&local_60);
    while( true ) {
      local_88.type = Unknown;
      local_88.variant.d.data.shared = (PrivateShared *)0x0;
      local_88.variant.d.data._8_8_ = 0;
      local_88.variant.d.data._16_8_ = 0;
      local_88.variant.d._24_8_ = 2;
      Value::operator=(&local_60,&local_88);
      ::QVariant::~QVariant(&local_88.variant);
      parseNextOperator(this,&local_60);
      if (local_60.type != Unknown) {
        QList<QCss::Value>::emplaceBack<QCss::Value_const&>(values,&local_60);
      }
      bVar1 = testTerm(this);
      if (!bVar1) break;
      local_88.type = Unknown;
      local_88.variant.d.data.shared = (PrivateShared *)0x0;
      local_88.variant.d.data._8_8_ = 0;
      local_88.variant.d.data._16_8_ = 0;
      local_88.variant.d._24_8_ = 2;
      Value::operator=(&local_60,&local_88);
      ::QVariant::~QVariant(&local_88.variant);
      bVar2 = parseTerm(this,&local_60);
      if (!bVar2) break;
      QList<QCss::Value>::emplaceBack<QCss::Value_const&>(values,&local_60);
    }
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  ::QVariant::~QVariant(&local_60.variant);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseExpr(QList<Value> *values)
{
    Value val;
    if (!parseTerm(&val)) return false;
    values->append(val);
    bool onceMore;
    do {
        onceMore = false;
        val = Value();
        if (!parseNextOperator(&val)) return false;
        if (val.type != QCss::Value::Unknown)
            values->append(val);
        if (testTerm()) {
            onceMore = true;
            val = Value();
            if (!parseTerm(&val)) return false;
            values->append(val);
        }
    } while (onceMore);
    return true;
}